

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O3

bool __thiscall wasm::EffectAnalyzer::invalidates(EffectAnalyzer *this,EffectAnalyzer *other)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  size_type sVar3;
  _Base_ptr p_Var4;
  const_iterator cVar5;
  byte bVar6;
  bool bVar7;
  byte bVar8;
  undefined1 auStack_58 [8];
  uint local;
  _Base_ptr local_40;
  _Rb_tree_node_base *local_38;
  
  if ((((((this->branchesOut == false) && (this->throws_ == false)) &&
        ((this->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
       ((this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) ||
      ((bVar7 = true, other->trap == false && (bVar2 = hasNonTrapSideEffects(other), !bVar2)))) &&
     ((((other->branchesOut == false &&
        ((other->throws_ == false &&
         ((other->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))) &&
       ((other->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) ||
      ((bVar7 = true, this->trap == false && (bVar2 = hasNonTrapSideEffects(this), !bVar2)))))) {
    bVar2 = this->writesMemory;
    if ((bVar2 == false) && (this->calls == false)) {
      bVar6 = other->writesMemory;
    }
    else {
      if (other->calls != false) {
        return true;
      }
      if (other->readsMemory != false) {
        return true;
      }
      bVar6 = other->writesMemory;
      if ((bool)bVar6 != false) {
        return true;
      }
    }
    if ((((bVar6 & 1) == 0) && (other->calls != true)) ||
       ((bVar7 = true, this->calls == false && (((this->readsMemory | bVar2) & 1U) == 0)))) {
      if ((this->writesTable == false) && (this->calls == false)) {
        bVar8 = other->writesTable;
      }
      else {
        if (other->calls != false) {
          return true;
        }
        if (other->readsTable != false) {
          return true;
        }
        bVar8 = other->writesTable;
        if ((bool)bVar8 != false) {
          return true;
        }
      }
      if ((((bVar8 & 1) == 0) && (other->calls != true)) ||
         ((bVar7 = true, this->calls == false &&
          (((this->writesTable | this->readsTable) & 1U) == 0)))) {
        if ((this->writesStruct == false) && (this->calls == false)) {
          bVar8 = other->writesStruct;
        }
        else {
          if (other->calls != false) {
            return true;
          }
          if (other->readsMutableStruct != false) {
            return true;
          }
          bVar8 = other->writesStruct;
          if ((bool)bVar8 != false) {
            return true;
          }
        }
        if ((((bVar8 & 1) == 0) && (other->calls != true)) ||
           ((bVar7 = true, this->calls == false &&
            (((this->writesStruct | this->readsMutableStruct) & 1U) == 0)))) {
          if ((this->writesArray == false) && (this->calls == false)) {
            bVar8 = other->writesArray;
          }
          else {
            if (other->calls != false) {
              return true;
            }
            if (other->readsArray != false) {
              return true;
            }
            bVar8 = other->writesArray;
            if ((bool)bVar8 != false) {
              return true;
            }
          }
          if (((((((bVar8 & 1) == 0) && (other->calls != true)) ||
                ((bVar7 = true, this->calls == false &&
                 (((this->writesArray | this->readsArray) & 1U) == 0)))) &&
               ((bVar7 = true, this->danglingPop == false && (other->danglingPop == false)))) &&
              ((this->isAtomic != true ||
               ((other->calls == false && (((bVar6 | other->readsMemory) & 1) == 0)))))) &&
             ((other->isAtomic != true ||
              ((this->calls == false && (((bVar2 | this->readsMemory) & 1U) == 0)))))) {
            p_Var4 = (this->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_40 = &(this->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_header;
            if (p_Var4 != local_40) {
              local_38 = (_Rb_tree_node_base *)&other->localsRead;
              do {
                auStack_58._0_4_ = p_Var4[1]._M_color;
                sVar3 = std::
                        set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                        count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)local_38,(key_type *)auStack_58);
                if (sVar3 != 0) {
                  return true;
                }
                sVar3 = std::
                        set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                        count(&other->localsWritten,(key_type *)auStack_58);
                if (sVar3 != 0) {
                  return true;
                }
                p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
              } while (p_Var4 != local_40);
            }
            p_Var4 = (this->localsRead)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_38 = &(this->localsRead)._M_t._M_impl.super__Rb_tree_header._M_header;
            if (p_Var4 != local_38) {
              do {
                auStack_58._0_4_ = p_Var4[1]._M_color;
                sVar3 = std::
                        set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                        count(&other->localsWritten,(key_type *)auStack_58);
                if (sVar3 != 0) {
                  return true;
                }
                p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
              } while (p_Var4 != local_38);
            }
            if (((other->calls != true) ||
                ((this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count +
                 (this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0))
               && ((this->calls != true ||
                   ((other->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count +
                    (other->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                    0)))) {
              p_Var4 = (this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var1 = &(this->globalsWritten)._M_t._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)p_Var4 != p_Var1) {
                local_38 = (_Rb_tree_node_base *)&other->mutableGlobalsRead;
                local_40 = &(other->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_header
                ;
                do {
                  auStack_58 = *(undefined1 (*) [8])(p_Var4 + 1);
                  _local = p_Var4[1]._M_parent;
                  cVar5 = std::
                          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                          ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                  *)local_38,(key_type *)auStack_58);
                  if (cVar5._M_node != local_40) {
                    return true;
                  }
                  cVar5 = std::
                          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                          ::find(&(other->globalsWritten)._M_t,(key_type *)auStack_58);
                  if ((_Rb_tree_header *)cVar5._M_node !=
                      &(other->globalsWritten)._M_t._M_impl.super__Rb_tree_header) {
                    return true;
                  }
                  p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
                } while ((_Rb_tree_header *)p_Var4 != p_Var1);
              }
              p_Var4 = (this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_left;
              local_38 = &(this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_header;
              if (p_Var4 != local_38) {
                local_40 = (_Base_ptr)&other->globalsWritten;
                do {
                  auStack_58 = *(undefined1 (*) [8])(p_Var4 + 1);
                  _local = p_Var4[1]._M_parent;
                  cVar5 = std::
                          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                          ::find(local_40,(key_type *)auStack_58);
                  if ((_Rb_tree_header *)cVar5._M_node !=
                      &(other->globalsWritten)._M_t._M_impl.super__Rb_tree_header) {
                    return true;
                  }
                  p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
                } while (p_Var4 != local_38);
              }
              if (((this->trap != true) ||
                  ((((other->branchesOut == false && (other->throws_ == false)) &&
                    ((other->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
                    ) && ((other->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                          0)))) &&
                 ((bVar2 = other->trap, bVar2 != true ||
                  (((this->branchesOut == false && (this->throws_ == false)) &&
                   (((this->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0
                    && ((this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0))
                   )))))) {
                if (this->trap == false) {
                  if ((((this->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
                        0 | this->throws_) & bVar2) == 1) goto LAB_001620de;
                }
                else {
                  if (((other->throws_ != false) ||
                      ((other->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
                       0)) || ((((this->delegateTargets)._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count != 0 | this->throws_) & bVar2) != 0)) {
LAB_001620de:
                    __assert_fail("!((trap && other.throws()) || (throws() && other.trap))",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/effects.h"
                                  ,0x118,
                                  "bool wasm::EffectAnalyzer::invalidates(const EffectAnalyzer &)");
                  }
                  if ((other->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
                  {
                    return true;
                  }
                  if (other->writesMemory != false) {
                    return true;
                  }
                  if (other->writesTable != false) {
                    return true;
                  }
                  if (other->writesStruct != false) {
                    return true;
                  }
                  if (other->writesArray != false) {
                    return true;
                  }
                  if (other->isAtomic != false) {
                    return true;
                  }
                  if (other->calls != false) {
                    return true;
                  }
                }
                if ((bVar2 == false) ||
                   ((((((this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0
                       && (this->writesMemory == false)) && (this->writesTable == false)) &&
                     ((this->writesStruct == false && (this->writesArray == false)))) &&
                    ((this->isAtomic == false && (this->calls == false)))))) {
                  bVar7 = false;
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar7;
}

Assistant:

bool invalidates(const EffectAnalyzer& other) {
    if ((transfersControlFlow() && other.hasSideEffects()) ||
        (other.transfersControlFlow() && hasSideEffects()) ||
        ((writesMemory || calls) && other.accessesMemory()) ||
        ((other.writesMemory || other.calls) && accessesMemory()) ||
        ((writesTable || calls) && other.accessesTable()) ||
        ((other.writesTable || other.calls) && accessesTable()) ||
        ((writesStruct || calls) && other.accessesMutableStruct()) ||
        ((other.writesStruct || other.calls) && accessesMutableStruct()) ||
        ((writesArray || calls) && other.accessesArray()) ||
        ((other.writesArray || other.calls) && accessesArray()) ||
        (danglingPop || other.danglingPop)) {
      return true;
    }
    // All atomics are sequentially consistent for now, and ordered wrt other
    // memory references.
    if ((isAtomic && other.accessesMemory()) ||
        (other.isAtomic && accessesMemory())) {
      return true;
    }
    for (auto local : localsWritten) {
      if (other.localsRead.count(local) || other.localsWritten.count(local)) {
        return true;
      }
    }
    for (auto local : localsRead) {
      if (other.localsWritten.count(local)) {
        return true;
      }
    }
    if ((other.calls && accessesMutableGlobal()) ||
        (calls && other.accessesMutableGlobal())) {
      return true;
    }
    for (auto global : globalsWritten) {
      if (other.mutableGlobalsRead.count(global) ||
          other.globalsWritten.count(global)) {
        return true;
      }
    }
    for (auto global : mutableGlobalsRead) {
      if (other.globalsWritten.count(global)) {
        return true;
      }
    }
    // We are ok to reorder implicit traps, but not conditionalize them.
    if ((trap && other.transfersControlFlow()) ||
        (other.trap && transfersControlFlow())) {
      return true;
    }
    // Note that the above includes disallowing the reordering of a trap with an
    // exception (as an exception can transfer control flow inside the current
    // function, so transfersControlFlow would be true) - while we allow the
    // reordering of traps with each other, we do not reorder exceptions with
    // anything.
    assert(!((trap && other.throws()) || (throws() && other.trap)));
    // We can't reorder an implicit trap in a way that could alter what global
    // state is modified.
    if ((trap && other.writesGlobalState()) ||
        (other.trap && writesGlobalState())) {
      return true;
    }
    return false;
  }